

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backend_sdl.cpp
# Opt level: O3

bool __thiscall
CCommandProcessorFragment_SDL::RunCommand
          (CCommandProcessorFragment_SDL *this,CCommand *pBaseCommand)

{
  uint uVar1;
  int iVar2;
  CCommand *pCVar3;
  SDL_Window *pSVar4;
  
  uVar1 = pBaseCommand->m_Cmd;
  if ((int)uVar1 < 20000) {
    if (uVar1 == 8) {
      SDL_GL_SwapWindow(this->m_pWindow);
      if (pBaseCommand[1].m_Cmd == 0) {
        return true;
      }
      glFinish();
      return true;
    }
    if (uVar1 != 9) {
      return false;
    }
    iVar2 = SDL_GL_SetSwapInterval(pBaseCommand[1].m_Cmd);
    *(bool *)&(pBaseCommand[1].m_pNext)->m_Cmd = iVar2 == 0;
  }
  else {
    if (uVar1 == 20000) {
      pCVar3 = pBaseCommand[1].m_pNext;
      this->m_GLContext = pCVar3;
      pSVar4 = *(SDL_Window **)(pBaseCommand + 1);
      this->m_pWindow = pSVar4;
    }
    else {
      if (uVar1 != 0x4e21) {
        return false;
      }
      pSVar4 = (SDL_Window *)0x0;
      pCVar3 = (CCommand *)0x0;
    }
    SDL_GL_MakeCurrent(pSVar4,pCVar3);
  }
  return true;
}

Assistant:

bool CCommandProcessorFragment_SDL::RunCommand(const CCommandBuffer::CCommand *pBaseCommand)
{
	switch(pBaseCommand->m_Cmd)
	{
	case CCommandBuffer::CMD_SWAP: Cmd_Swap(static_cast<const CCommandBuffer::CSwapCommand *>(pBaseCommand)); break;
	case CCommandBuffer::CMD_VSYNC: Cmd_VSync(static_cast<const CCommandBuffer::CVSyncCommand *>(pBaseCommand)); break;
	case CMD_INIT: Cmd_Init(static_cast<const CInitCommand *>(pBaseCommand)); break;
	case CMD_SHUTDOWN: Cmd_Shutdown(static_cast<const CShutdownCommand *>(pBaseCommand)); break;
	default: return false;
	}

	return true;
}